

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

Query * q_or(vector<Query,_std::allocator<Query>_> *queries)

{
  vector<Query,_std::allocator<Query>_> *in_RSI;
  Query *in_RDI;
  Query *unaff_retaddr;
  
  Query::Query(unaff_retaddr,&in_RDI->type,in_RSI);
  return in_RDI;
}

Assistant:

Query q_or(std::vector<Query> &&queries) {
    return Query(QueryType::OR, std::move(queries));
}